

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxOutCountByHandle(void *handle,void *tx_data_handle,uint32_t *count)

{
  uint32_t uVar1;
  string *message;
  uint32_t *in_RDX;
  CfdException *in_RSI;
  string *in_stack_00000028;
  void *in_stack_00000030;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext *tx_1;
  TransactionContext *tx;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  allocator *paVar2;
  CfdException *this;
  allocator local_89;
  bool *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  allocator local_51;
  string local_50 [48];
  uint32_t *local_20;
  CfdException *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  this = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"TransactionData",&local_51);
  cfd::capi::CheckBuffer(in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::capi::ConvertNetType(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
  if ((local_18->message_)._M_string_length != 0) {
    if (local_20 != (uint32_t *)0x0) {
      uVar1 = cfd::core::ConfidentialTransaction::GetTxOutCount
                        ((ConfidentialTransaction *)(local_18->message_)._M_string_length);
      *local_20 = uVar1;
    }
    return 0;
  }
  message = (string *)__cxa_allocate_exception(0x30);
  paVar2 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff78,"Invalid handle state. tx is null",paVar2);
  cfd::core::CfdException::CfdException(this,(CfdError)((ulong)paVar2 >> 0x20),message);
  __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxOutCountByHandle(
    void* handle, void* tx_data_handle, uint32_t* count) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (count != nullptr) *count = tx->GetTxOutCount();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (count != nullptr) *count = tx->GetTxOutCount();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}